

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintableTextTest.cpp
# Opt level: O2

void __thiscall PrintableTextTest::PrintableTextTest(PrintableTextTest *this)

{
  _Head_base<0UL,_const_oout::Test_*,_false> _Var1;
  unique_ptr<oout::PrintableText<bool>,_std::default_delete<oout::PrintableText<bool>_>_> local_40;
  unique_ptr<oout::PrintableText<bool>,_std::default_delete<oout::PrintableText<bool>_>_> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  char local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  _Head_base<0UL,_const_oout::Test_*,_false> local_18;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PrintableTextTest_001cc688;
  std::make_unique<oout::PrintableText<bool>,bool>((bool *)&local_40);
  std::
  make_shared<oout::EqualTest,std::unique_ptr<oout::PrintableText<bool>,std::default_delete<oout::PrintableText<bool>>>,char_const(&)[5]>
            (&local_38,(char (*) [5])&local_40);
  std::make_shared<oout::NamedTest_const,char_const(&)[26],std::shared_ptr<oout::EqualTest>>
            ((char (*) [26])local_28,(shared_ptr<oout::EqualTest> *)"Boolean represent as text");
  std::make_unique<oout::NamedTest,char_const(&)[18],std::shared_ptr<oout::NamedTest_const>>
            ((char (*) [18])&local_18,(shared_ptr<const_oout::NamedTest> *)"PrintableTextTest");
  _Var1._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (Test *)0x0;
  (this->tests)._M_t.super___uniq_ptr_impl<const_oout::Test,_std::default_delete<const_oout::Test>_>
  ._M_t.super__Tuple_impl<0UL,_const_oout::Test_*,_std::default_delete<const_oout::Test>_>.
  super__Head_base<0UL,_const_oout::Test_*,_false>._M_head_impl = _Var1._M_head_impl;
  std::unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_>::~unique_ptr
            ((unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_> *)&local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::unique_ptr<oout::PrintableText<bool>,_std::default_delete<oout::PrintableText<bool>_>_>::
  ~unique_ptr(&local_40);
  return;
}

Assistant:

PrintableTextTest::PrintableTextTest()
	: tests(
		make_unique<NamedTest>(
			"PrintableTextTest",
			make_shared<const NamedTest>(
				"Boolean represent as text",
				make_shared<EqualTest>(
					make_unique<PrintableText<bool>>(
						true
					),
					"true"
				)
			)
		)
	)
{
}